

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O3

int nn_sipc_send(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *self_00;
  nn_chunkref *self_01;
  int extraout_EAX;
  size_t sVar1;
  size_t sVar2;
  nn_fsm *in_RCX;
  nn_epbase *epbase;
  long lVar3;
  int src;
  ulong uVar4;
  nn_fsm *self_02;
  nn_fsm_event *pnVar5;
  nn_iovec iov [3];
  nn_iovec local_68;
  void *local_58;
  size_t local_50;
  void *local_48;
  size_t local_40;
  
  pnVar5 = &self[-3].in;
  if (self == (nn_pipebase *)0x0) {
    pnVar5 = (nn_fsm_event *)0x0;
  }
  uVar4 = (ulong)(uint)((nn_ep_options *)(pnVar5 + 2))->ipv4only;
  if (((nn_ep_options *)(pnVar5 + 2))->ipv4only == 4) {
    if (*(int *)((long)(pnVar5 + 0x15) + 0x10) == 1) {
      self_00 = (nn_msg *)((long)(pnVar5 + 0x15) + 0x20);
      nn_msg_term(self_00);
      nn_msg_mv(self_00,msg);
      *(undefined1 *)((long)(pnVar5 + 0x15) + 0x14) = 1;
      sVar1 = nn_chunkref_size((nn_chunkref *)self_00);
      self_01 = (nn_chunkref *)((long)(pnVar5 + 0x17) + 0x10);
      sVar2 = nn_chunkref_size(self_01);
      nn_putll((uint8_t *)((long)(pnVar5 + 0x15) + 0x15),sVar1 + sVar2);
      local_68.iov_len = 9;
      local_68.iov_base = (void *)((long)(pnVar5 + 0x15) + 0x14);
      local_58 = nn_chunkref_data((nn_chunkref *)self_00);
      local_50 = nn_chunkref_size((nn_chunkref *)self_00);
      local_48 = nn_chunkref_data(self_01);
      local_40 = nn_chunkref_size(self_01);
      nn_usock_send(*(nn_usock **)((long)((nn_ep_options *)(pnVar5 + 2) + 1) + 4),&local_68,3);
      *(undefined4 *)((long)(pnVar5 + 0x15) + 0x10) = 2;
      return 0;
    }
  }
  else {
    nn_sipc_send_cold_1();
  }
  nn_sipc_send_cold_2();
  lVar3 = uVar4 - 0x210;
  if (uVar4 == 0) {
    lVar3 = 0;
  }
  self_02 = (nn_fsm *)(ulong)*(uint *)(lVar3 + 0x58);
  if (*(uint *)(lVar3 + 0x58) == 4) {
    if (*(int *)(lVar3 + 0x2e8) == 3) {
      nn_msg_mv(msg,(nn_msg *)(lVar3 + 0x2f8));
      nn_msg_init((nn_msg *)(lVar3 + 0x2f8),0);
      *(undefined4 *)(lVar3 + 0x2e8) = 1;
      nn_usock_recv(*(nn_usock **)(lVar3 + 0x60),(void *)(lVar3 + 0x2ec),9,(int *)0x0);
      return 0;
    }
  }
  else {
    nn_sipc_recv_cold_1();
  }
  src = (int)msg;
  nn_sipc_recv_cold_2();
  nn_fsm_init(self_02,nn_sipc_handler,nn_sipc_shutdown,src,self_02,in_RCX);
  *(undefined4 *)&self_02[1].fn = 1;
  nn_streamhdr_init((nn_streamhdr *)&self_02[1].state,2,self_02);
  self_02[1].shutdown_fn = (nn_fsm_fn)0x0;
  self_02[5].stopped.type = -1;
  self_02[5].stopped.item.next = (nn_queue_item *)0x0;
  nn_pipebase_init((nn_pipebase *)(self_02 + 6),&nn_sipc_pipebase_vfptr,epbase);
  *(undefined4 *)&self_02[8].ctx = 0xffffffff;
  nn_msg_init((nn_msg *)&self_02[8].stopped.src,0);
  *(undefined4 *)&self_02[9].stopped.srcptr = 0xffffffff;
  nn_msg_init((nn_msg *)&self_02[9].stopped.item,0);
  nn_fsm_event_init((nn_fsm_event *)(self_02 + 0xb));
  return extraout_EAX;
}

Assistant:

static int nn_sipc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sipc *sipc;
    struct nn_iovec iov [3];

    sipc = nn_cont (self, struct nn_sipc, pipebase);

    nn_assert_state (sipc, NN_SIPC_STATE_ACTIVE);
    nn_assert (sipc->outstate == NN_SIPC_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&sipc->outmsg);
    nn_msg_mv (&sipc->outmsg, msg);

    /*  Serialise the message header. */
    sipc->outhdr [0] = NN_SIPC_MSG_NORMAL;
    nn_putll (sipc->outhdr + 1, nn_chunkref_size (&sipc->outmsg.sphdr) +
        nn_chunkref_size (&sipc->outmsg.body));

    /*  Start async sending. */
    iov [0].iov_base = sipc->outhdr;
    iov [0].iov_len = sizeof (sipc->outhdr);
    iov [1].iov_base = nn_chunkref_data (&sipc->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&sipc->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&sipc->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&sipc->outmsg.body);
    nn_usock_send (sipc->usock, iov, 3);

    sipc->outstate = NN_SIPC_OUTSTATE_SENDING;

    return 0;
}